

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O1

void __thiscall SCCLiveness::ExtendLifetime(SCCLiveness *this,Lifetime *lifetime,Instr *instr)

{
  RealCount *pRVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  StackSym *pSVar5;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  JitArenaAllocator *this_00;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  code *pcVar9;
  bool bVar10;
  BOOLEAN BVar11;
  uint uVar12;
  uint uVar13;
  uint32 uVar14;
  undefined4 *puVar15;
  Type pSVar16;
  NodeBase *pNVar17;
  Type *ppLVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar19;
  uint uVar20;
  uint uVar21;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  Loop *pLVar22;
  undefined1 local_60 [8];
  Iterator __iter;
  
  if (lifetime == (Lifetime *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a7,"(lifetime != nullptr)","Lifetime not provided");
    if (!bVar10) goto LAB_0062acb8;
    *puVar15 = 0;
  }
  if (lifetime->sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a8,"(lifetime->sym != nullptr)","Lifetime has no symbol");
    if (!bVar10) goto LAB_0062acb8;
    *puVar15 = 0;
  }
  if ((SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->extendedLifetimesLoopList->super_SListNodeBase<Memory::ArenaAllocator>).next !=
      this->extendedLifetimesLoopList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a9,"(this->extendedLifetimesLoopList->Empty())",
                        "this->extendedLifetimesLoopList->Empty()");
    if (!bVar10) goto LAB_0062acb8;
    *puVar15 = 0;
  }
  uVar21 = lifetime->start;
  uVar14 = lifetime->end;
  pLVar22 = this->curLoop;
  if (pLVar22 == (Loop *)0x0) {
    pNVar17 = (NodeBase *)0x0;
  }
  else {
    pSVar5 = lifetime->sym;
    __iter.current = (NodeBase *)0x0;
    do {
      BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((pLVar22->regAlloc).liveOnBackEdgeSyms,(pSVar5->super_Sym).m_id);
      uVar12 = uVar14;
      if (BVar11 != '\0') {
        uVar2 = (pLVar22->regAlloc).loopStart;
        uVar19 = extraout_RDX;
        uVar20 = uVar21;
        if (uVar2 < uVar21) {
          pSVar6 = this->extendedLifetimesLoopList;
          pSVar16 = (Type)new<Memory::ArenaAllocator>
                                    (0x10,&this->tempAlloc->super_ArenaAllocator,0x366bee);
          pSVar16[1].next = (Type)pLVar22;
          pSVar16->next = (pSVar6->super_SListNodeBase<Memory::ArenaAllocator>).next;
          (pSVar6->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar16;
          (pSVar6->super_RealCount).count = (pSVar6->super_RealCount).count + 1;
          uVar19 = extraout_RDX_00;
          uVar20 = uVar2;
        }
        uVar3 = (pLVar22->regAlloc).loopEnd;
        if (uVar14 < uVar3) {
          uVar12 = uVar3;
        }
        __iter.current = (NodeBase *)CONCAT71((int7)((ulong)uVar19 >> 8),1);
        bVar10 = uVar21 <= uVar2;
        uVar21 = uVar20;
        if ((bVar10) && (uVar14 < uVar3)) {
          pSVar6 = this->extendedLifetimesLoopList;
          pSVar16 = (Type)new<Memory::ArenaAllocator>
                                    (0x10,&this->tempAlloc->super_ArenaAllocator,0x366bee);
          pSVar16[1].next = (Type)pLVar22;
          pSVar16->next = (pSVar6->super_SListNodeBase<Memory::ArenaAllocator>).next;
          (pSVar6->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar16;
          (pSVar6->super_RealCount).count = (pSVar6->super_RealCount).count + 1;
          uVar12 = uVar3;
        }
      }
      uVar14 = uVar12;
      pLVar22 = pLVar22->parent;
      pNVar17 = __iter.current;
    } while (pLVar22 != (Loop *)0x0);
  }
  if (((ulong)pNVar17 & 1) == 0) {
    uVar21 = lifetime->end;
    uVar14 = IR::Instr::GetNumber(instr);
    if (uVar21 < uVar14) {
      uVar14 = IR::Instr::GetNumber(instr);
      lifetime->end = uVar14;
      uVar4 = this->totalOpHelperFullVisitedLength;
      uVar13 = CurrentOpHelperVisitedLength(this,instr);
      lifetime->totalOpHelperLengthByEnd = uVar13 + uVar4;
    }
    goto LAB_0062ac76;
  }
  uVar12 = lifetime->start;
  if (uVar21 < uVar12) {
    lifetime->start = uVar21;
  }
  if (lifetime->end < uVar14) {
    lifetime->end = uVar14;
LAB_0062ab19:
    local_60 = (undefined1  [8])this->extendedLifetimesLoopList;
    __iter.list = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (__iter.list == (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar15 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar10) goto LAB_0062acb8;
        *puVar15 = 0;
      }
      __iter.list = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      pSVar6 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])__iter.list == local_60) break;
      ppLVar18 = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_60);
      pSVar7 = ((*ppLVar18)->regAlloc).extendedLifetime;
      pSVar16 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar7->allocator,0x366bee);
      pSVar16[1].next = (Type)lifetime;
      pSVar16->next =
           (pSVar7->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pSVar7->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar16;
      pRVar1 = &(pSVar7->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
  }
  else {
    pSVar6 = __iter.list;
    if (uVar21 < uVar12) goto LAB_0062ab19;
  }
  __iter.list = pSVar6;
  bVar10 = IR::Instr::HasLazyBailOut(instr);
  if (((bVar10) || (uVar21 = lifetime->end, uVar14 = IR::Instr::GetNumber(instr), uVar21 <= uVar14))
     && ((bVar10 = IR::Instr::HasLazyBailOut(instr), !bVar10 ||
         (uVar21 = lifetime->end, uVar14 = IR::Instr::GetNumber(instr), uVar21 < uVar14)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2f9,
                        "((!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) || (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()))"
                        ,"Lifetime end not set correctly");
    if (!bVar10) {
LAB_0062acb8:
      pcVar9 = (code *)invalidInstructionException();
      (*pcVar9)();
    }
    *puVar15 = 0;
  }
LAB_0062ac76:
  pSVar6 = this->extendedLifetimesLoopList;
  buffer = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
           (pSVar6->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (buffer != pSVar6) {
    this_00 = this->tempAlloc;
    do {
      pSVar8 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
               (buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                 buffer,0x10);
      buffer = pSVar8;
    } while (pSVar8 != pSVar6);
  }
  (pSVar6->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar6->super_SListNodeBase<Memory::ArenaAllocator>;
  (pSVar6->super_RealCount).count = 0;
  return;
}

Assistant:

void
SCCLiveness::ExtendLifetime(Lifetime *lifetime, IR::Instr *instr)
{
    AssertMsg(lifetime != nullptr, "Lifetime not provided");
    AssertMsg(lifetime->sym != nullptr, "Lifetime has no symbol");
    Assert(this->extendedLifetimesLoopList->Empty());

    // Find the loop that we need to extend the lifetime to
    StackSym * sym = lifetime->sym;
    Loop * loop = this->curLoop;
    uint32 extendedLifetimeStart = lifetime->start;
    uint32 extendedLifetimeEnd = lifetime->end;
    bool isLiveOnBackEdge = false;
    bool loopAddedToList = false;

    while (loop)
    {
        if (loop->regAlloc.liveOnBackEdgeSyms->Test(sym->m_id))
        {
            isLiveOnBackEdge = true;
            if (loop->regAlloc.loopStart < extendedLifetimeStart)
            {
                extendedLifetimeStart = loop->regAlloc.loopStart;
                this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                loopAddedToList = true;
            }
            if (loop->regAlloc.loopEnd > extendedLifetimeEnd)
            {
                extendedLifetimeEnd = loop->regAlloc.loopEnd;
                if (!loopAddedToList)
                {
                    this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                }
            }
        }
        loop = loop->parent;
        loopAddedToList = false;
    }

    if (!isLiveOnBackEdge)
    {
        // Don't extend lifetime to loop boundary if the use are not live on back edge
        // Note: the above loop doesn't detect a reg that is live on an outer back edge
        // but not an inner one, so we can't assume here that the lifetime hasn't been extended
        // past the current instruction.
        if (lifetime->end < instr->GetNumber())
        {
            lifetime->end = instr->GetNumber();
            lifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(instr);
        }
    }
    else
    {
        // extend lifetime to the outer most loop boundary that have the symbol live on back edge.
        bool isLifetimeExtended = false;
        if (lifetime->start > extendedLifetimeStart)
        {
            isLifetimeExtended = true;
            lifetime->start = extendedLifetimeStart;
        }

        if (lifetime->end < extendedLifetimeEnd)
        {
            isLifetimeExtended = true;
            lifetime->end = extendedLifetimeEnd;
            // The total op helper length by the end of this lifetime will be updated once we reach the loop tail
        }

        if (isLifetimeExtended)
        {
            // Keep track of the lifetime extended for this loop so we can update the call bits
            FOREACH_SLISTBASE_ENTRY(Loop *, currLoop, this->extendedLifetimesLoopList)
            {
                currLoop->regAlloc.extendedLifetime->Prepend(lifetime);
            }
            NEXT_SLISTBASE_ENTRY
        }
#if _M_ARM64
        // The case of equality is valid on Arm64 where some branch instructions have sources.
        AssertMsg(lifetime->end >= instr->GetNumber(), "Lifetime end not set correctly");
#else
        AssertMsg(
            (!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) ||
            (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()),
            "Lifetime end not set correctly"
        );
#endif
    }
    this->extendedLifetimesLoopList->Clear(this->tempAlloc);
}